

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O1

void * rw::copyMaterialMatFX(void *dst,void *src,int32 offset,int32 param_4)

{
  int *piVar1;
  int iVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  byte bVar8;
  
  bVar8 = 0;
  puVar6 = *(undefined8 **)((long)src + (long)offset);
  if (puVar6 != (undefined8 *)0x0) {
    allocLocation =
         "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/matfx.cpp line: 376"
    ;
    puVar3 = (undefined8 *)(*DAT_00149de8)(0x58,0x30120);
    *(undefined8 **)((long)dst + (long)offset) = puVar3;
    puVar7 = puVar3;
    for (lVar4 = 0xb; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = *puVar6;
      puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
      puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
    }
    lVar4 = 0x18;
    do {
      iVar2 = *(int *)((long)puVar3 + lVar4 + -0x18);
      if (iVar2 == 4) {
        lVar5 = *(long *)((long)puVar3 + lVar4 + -0x10);
LAB_0012fa31:
        if (lVar5 != 0) {
          *(int *)(lVar5 + 100) = *(int *)(lVar5 + 100) + 1;
        }
      }
      else {
        if (iVar2 == 2) {
          lVar5 = *(long *)((long)puVar3 + lVar4 + -8);
          goto LAB_0012fa31;
        }
        if (iVar2 == 1) {
          lVar5 = *(long *)((long)puVar3 + lVar4 + -8);
          if (lVar5 != 0) {
            piVar1 = (int *)(lVar5 + 100);
            *piVar1 = *piVar1 + 1;
          }
          lVar5 = *(long *)((long)puVar3 + lVar4);
          goto LAB_0012fa31;
        }
      }
      lVar4 = lVar4 + 0x28;
    } while (lVar4 == 0x40);
  }
  return dst;
}

Assistant:

static void*
copyMaterialMatFX(void *dst, void *src, int32 offset, int32)
{
	MatFX *srcfx = *PLUGINOFFSET(MatFX*, src, offset);
	if(srcfx == nil)
		return dst;
	MatFX *dstfx = rwNewT(MatFX, 1, MEMDUR_EVENT | ID_MATFX);
	*PLUGINOFFSET(MatFX*, dst, offset) = dstfx;
	memcpy(dstfx, srcfx, sizeof(MatFX));
	for(int i = 0; i < 2; i++)
		switch(dstfx->fx[i].type){
		case MatFX::BUMPMAP:
			if(dstfx->fx[i].bump.bumpedTex)
				dstfx->fx[i].bump.bumpedTex->addRef();
			if(dstfx->fx[i].bump.tex)
				dstfx->fx[i].bump.tex->addRef();
			break;

		case MatFX::ENVMAP:
			if(dstfx->fx[i].env.tex)
				dstfx->fx[i].env.tex->addRef();
			break;

		case MatFX::DUAL:
			if(dstfx->fx[i].dual.tex)
				dstfx->fx[i].dual.tex->addRef();
			break;
		}
	return dst;
}